

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

void Cbs_ManAssign(Cbs_Man_t *p,Gia_Obj_t *pObj,int Level,Gia_Obj_t *pRes0,Gia_Obj_t *pRes1)

{
  uint uVar1;
  int Entry;
  int Entry_00;
  Gia_Obj_t *pObj_00;
  
  pObj_00 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(ulong *)pObj_00;
  if (((~uVar1 & 0x9fffffff) != 0) && ((int)uVar1 < 0 || (~uVar1 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1fe,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    __assert_fail("!Cbs_VarIsAssigned(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x1ff,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  *(ulong *)pObj_00 =
       (*(ulong *)pObj_00 & 0xbfffffffbfffffff | (ulong)((uint)pObj & 1) << 0x3e) ^
       0x4000000040000000;
  if (pObj_00->Value == 0xffffffff) {
    pObj_00->Value = (p->pProp).iTail;
    Cbs_QuePush(&p->pProp,pObj_00);
    Vec_IntPush(p->vLevReas,Level);
    Entry_00 = 0;
    Entry = 0;
    if (pRes0 != (Gia_Obj_t *)0x0) {
      Entry = (int)(((long)pRes0 - (long)pObj_00) / 0xc);
    }
    Vec_IntPush(p->vLevReas,Entry);
    if (pRes1 != (Gia_Obj_t *)0x0) {
      Entry_00 = (int)(((long)pRes1 - (long)pObj_00) / 0xc);
    }
    Vec_IntPush(p->vLevReas,Entry_00);
    if (p->vLevReas->nSize == (p->pProp).iTail * 3) {
      return;
    }
    __assert_fail("Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x208,
                  "void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  __assert_fail("pObjR->Value == ~0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                ,0x202,"void Cbs_ManAssign(Cbs_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline void Cbs_ManAssign( Cbs_Man_t * p, Gia_Obj_t * pObj, int Level, Gia_Obj_t * pRes0, Gia_Obj_t * pRes1 )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs_VarIsAssigned(pObjR) );
    Cbs_VarAssign( pObjR );
    Cbs_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    assert( pObjR->Value == ~0 );
    pObjR->Value = p->pProp.iTail;
    Cbs_QuePush( &p->pProp, pObjR );
    Vec_IntPush( p->vLevReas, Level );
    Vec_IntPush( p->vLevReas, pRes0 ? pRes0-pObjR : 0 );
    Vec_IntPush( p->vLevReas, pRes1 ? pRes1-pObjR : 0 );
    assert( Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail );
//    s_Counter++;
//    s_Counter = Abc_MaxIntInt( s_Counter, Vec_IntSize(p->vLevReas)/3 );
}